

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O1

bool __thiscall TasgridWrapper::readGridfile(TasgridWrapper *this)

{
  long lVar1;
  int iVar2;
  TypeOneDRule TVar3;
  
  TasGrid::TasmanianSparseGrid::read((char *)this);
  lVar1 = *(long *)&this->field_0x8;
  if (lVar1 == 0) {
    this->num_dimensions = 0;
    iVar2 = 0;
  }
  else {
    this->num_dimensions = *(int *)(lVar1 + 0x10);
    iVar2 = *(int *)(lVar1 + 0x14);
  }
  this->num_outputs = iVar2;
  TVar3 = TasGrid::TasmanianSparseGrid::getRule();
  this->rule = TVar3;
  return true;
}

Assistant:

bool TasgridWrapper::readGridfile(){
    try{
        grid.read(gridfilename);
    }catch(std::runtime_error &e){
        cerr << e.what() << "\n";
        return false;
    }
    num_dimensions = grid.getNumDimensions();
    num_outputs = grid.getNumOutputs();
    rule = grid.getRule();
    return true;
}